

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<int>::erase
          (RepeatedField<int> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator piVar2;
  iterator piVar3;
  int *piVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<int> *this_local;
  
  piVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)piVar2 >> 2);
  if (first != last) {
    piVar2 = cend(this);
    piVar3 = begin(this);
    piVar4 = std::copy<int_const*,int*>(last,piVar2,piVar3 + iVar1);
    piVar2 = cbegin(this);
    Truncate(this,(int)((long)piVar4 - (long)piVar2 >> 2));
  }
  piVar3 = begin(this);
  return piVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}